

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O0

void SignalProcessing::FIRFilter::coefficients_for_idealised_filter_response
               (short *filter_coefficients,float *A,float attenuation,size_t number_of_taps)

{
  float fVar1;
  value_type vVar2;
  ulong uVar3;
  reference pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_b4;
  size_type local_a0;
  size_t i_3;
  size_type sStack_90;
  float coefficientMultiplier;
  size_t i_2;
  size_type sStack_80;
  float coefficientTotal;
  size_t i_1;
  uint i;
  float Np_squared;
  float I0;
  size_t Np;
  allocator<float> local_49;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> filter_coefficients_float;
  float a;
  size_t number_of_taps_local;
  float attenuation_local;
  float *A_local;
  short *filter_coefficients_local;
  
  if (21.0 <= attenuation) {
    if (attenuation <= 50.0) {
      fVar5 = powf(attenuation - 21.0,0.4);
      filter_coefficients_float.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           fVar5 * 0.5842 + (attenuation - 21.0) * 0.7886;
    }
    else {
      filter_coefficients_float.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (attenuation - 8.7) * 0.1102;
    }
  }
  else {
    filter_coefficients_float.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
  }
  std::allocator<float>::allocator(&local_49);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_48,number_of_taps,&local_49);
  std::allocator<float>::~allocator(&local_49);
  uVar3 = number_of_taps - 1 >> 1;
  fVar5 = ino(filter_coefficients_float.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_);
  local_b4 = (float)(uVar3 * uVar3);
  for (i_1._4_4_ = 0;
      fVar7 = filter_coefficients_float.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_, i_1._4_4_ <= uVar3;
      i_1._4_4_ = i_1._4_4_ + 1) {
    fVar1 = A[i_1._4_4_];
    fVar6 = sqrtf(1.0 - (float)(i_1._4_4_ * i_1._4_4_) / local_b4);
    fVar7 = ino(fVar7 * fVar6);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,uVar3 + i_1._4_4_);
    *pvVar4 = (fVar1 * fVar7) / fVar5;
  }
  for (sStack_80 = 0; sStack_80 < uVar3; sStack_80 = sStack_80 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,
                        (number_of_taps - 1) - sStack_80);
    vVar2 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,sStack_80);
    *pvVar4 = vVar2;
  }
  i_2._4_4_ = 0.0;
  for (sStack_90 = 0; sStack_90 < number_of_taps; sStack_90 = sStack_90 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,sStack_90);
    i_2._4_4_ = *pvVar4 + i_2._4_4_;
  }
  for (local_a0 = 0; local_a0 < number_of_taps; local_a0 = local_a0 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,local_a0);
    filter_coefficients[local_a0] = (short)(int)(*pvVar4 * 32767.0 * (1.0 / i_2._4_4_));
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  return;
}

Assistant:

void FIRFilter::coefficients_for_idealised_filter_response(short *filter_coefficients, float *A, float attenuation, std::size_t number_of_taps) {
	/* calculate alpha, which is the Kaiser-Bessel window shape factor */
	float a;	// to take the place of alpha in the normal derivation

	if(attenuation < 21.0f) {
		a = 0.0f;
	} else {
		if(attenuation > 50.0f)
			a = 0.1102f * (attenuation - 8.7f);
		else
			a = 0.5842f * powf(attenuation - 21.0f, 0.4f) + 0.7886f * (attenuation - 21.0f);
	}

	std::vector<float> filter_coefficients_float(number_of_taps);

	/* work out the right hand side of the filter coefficients */
	std::size_t Np = (number_of_taps - 1) / 2;
	float I0 = ino(a);
	float Np_squared = float(Np * Np);
	for(unsigned int i = 0; i <= Np; ++i) {
		filter_coefficients_float[Np + i] =
				A[i] *
				ino(a * sqrtf(1.0f - (float(i * i) / Np_squared) )) /
				I0;
	}

	/* coefficients are symmetrical, so copy from right hand side to left side */
	for(std::size_t i = 0; i < Np; ++i) {
		filter_coefficients_float[i] = filter_coefficients_float[number_of_taps - 1 - i];
	}

	/* scale back up so that we retain 100% of input volume */
	float coefficientTotal = 0.0f;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		coefficientTotal += filter_coefficients_float[i];
	}

	/* we'll also need integer versions, potentially */
	float coefficientMultiplier = 1.0f / coefficientTotal;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		filter_coefficients[i] = short(filter_coefficients_float[i] * FixedMultiplier * coefficientMultiplier);
	}
}